

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall GlobOpt::PrepareForIgnoringIntOverflow(GlobOpt *this,Instr *instr)

{
  SymKind SVar1;
  ushort uVar2;
  Type pBVar3;
  code *pcVar4;
  GlobOpt *this_00;
  bool bVar5;
  bool bVar6;
  BOOLEAN BVar7;
  BOOLEAN BVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  IntOverflowDoesNotMatterRange *pIVar12;
  PropertySym *propertySym;
  Value *value;
  FloatConstantValueInfo *pFVar13;
  StackSym *pSVar14;
  BVSparseNode *pBVar15;
  JITTimeFunctionBody *pJVar16;
  FunctionJITTimeInfo *pFVar17;
  char16 *pcVar18;
  char16 *pcVar19;
  ushort uVar20;
  uint uVar21;
  BVSparseNode *pBVar22;
  Type_conflict pBVar23;
  ulong uVar24;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  ulong uVar25;
  uint uVar26;
  SymID id;
  GlobOptBlockData *this_02;
  wchar local_f8 [4];
  char16 debugStringBuffer [42];
  BVSparse<Memory::JitArenaAllocator> local_88;
  BVSparse<Memory::JitArenaAllocator> local_68;
  SymID local_48;
  uint local_44;
  undefined4 *local_40;
  GlobOpt *local_38;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x36d7,"(instr)","instr");
    if (!bVar5) goto LAB_00448878;
    *puVar11 = 0;
  }
  uVar2 = *(ushort *)&instr->field_0x36;
  uVar26 = (uint)instr->m_opcode;
  if ((uVar2 >> 8 & 1) != 0) {
    if ((this->field_0xf4 & 2) == 0) {
      uVar20 = 0x100;
    }
    else {
      bVar5 = OpCodeAttr::IsInt32(instr->m_opcode);
      uVar20 = (ushort)bVar5 << 8;
      uVar2 = *(ushort *)&instr->field_0x36;
    }
    *(ushort *)&instr->field_0x36 = uVar20 | uVar2 & 0xfeff;
  }
  pIVar12 = this->intOverflowDoesNotMatterRange;
  if (pIVar12 == (IntOverflowDoesNotMatterRange *)0x0) {
    if ((this->field_0xf4 & 2) != 0) goto LAB_004486b7;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x36e4,"(intOverflowCurrentlyMattersInRange)",
                       "intOverflowCurrentlyMattersInRange");
    if (bVar5) {
      *puVar11 = 0;
      goto LAB_004486b7;
    }
    goto LAB_00448878;
  }
  if (pIVar12->lastInstr == instr) {
    if (uVar26 != 0x247) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x36ec,"(isBoundary)","isBoundary");
      if (!bVar5) goto LAB_00448878;
      *puVar11 = 0;
      pIVar12 = this->intOverflowDoesNotMatterRange;
    }
    this->field_0xf4 = this->field_0xf4 | 2;
    this->intOverflowDoesNotMatterRange = pIVar12->next;
    goto LAB_004486b7;
  }
  uVar21 = *(uint *)&this->field_0xf4;
  if (((uVar21 & 2) == 0) || (pIVar12->firstInstr != instr)) goto LAB_004486b7;
  if (uVar26 != 0x247) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x36ff,"(isBoundary)","isBoundary");
    if (!bVar5) goto LAB_00448878;
    *puVar11 = 0;
    uVar21 = *(uint *)&this->field_0xf4;
    pIVar12 = this->intOverflowDoesNotMatterRange;
  }
  *(uint *)&this->field_0xf4 = uVar21 & 0xfffffffd;
  local_88.alloc = this->tempAlloc;
  local_68.lastUsedNodePrevNextField = &local_68.head;
  local_68.head = (BVSparseNode *)0x0;
  local_68.lastFoundIndex = (Type_conflict)0x0;
  local_88.lastUsedNodePrevNextField = &local_88.head;
  local_88.head = (BVSparseNode *)0x0;
  local_88.lastFoundIndex = (Type_conflict)0x0;
  pBVar23 = (pIVar12->symsRequiredToBeInt).head;
  local_68.alloc = local_88.alloc;
  local_38 = this;
  if (pBVar23 == (Type_conflict)0x0) {
LAB_0044827b:
    if (this->prePassLoop == (Loop *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,&local_68);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (&local_38->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,&local_68);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (&local_38->intOverflowDoesNotMatterRange->symsRequiredToBeInt,&local_88);
      this_00 = local_38;
      BVSparse<Memory::JitArenaAllocator>::Minus
                (&local_68,(local_38->currentBlock->globOptData).liveInt32Syms,
                 (local_38->currentBlock->globOptData).liveLossyInt32Syms);
      BVSparse<Memory::JitArenaAllocator>::And
                (&local_88,&this_00->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                 (this_00->currentBlock->globOptData).liveLossyInt32Syms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (&local_68,&local_88);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (&this_00->intOverflowDoesNotMatterRange->symsRequiredToBeInt,&local_68);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (&this_00->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,&local_68);
      BVSparse<Memory::JitArenaAllocator>::Or
                (&local_68,(this_00->currentBlock->globOptData).liveInt32Syms,
                 (this_00->currentBlock->globOptData).liveFloat64Syms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (&local_68,(this_00->currentBlock->globOptData).liveVarSyms);
      this_01 = &local_88;
      BVSparse<Memory::JitArenaAllocator>::Minus
                (this_01,&this_00->intOverflowDoesNotMatterRange->symsRequiredToBeInt,&local_68);
      do {
        this_01 = (BVSparse<Memory::JitArenaAllocator> *)this_01->head;
        if (this_01 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_004483f9;
      } while (((Type *)&this_01->alloc)->word == 0);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x37b1,"(deadSymsRequiredToBeInt.IsEmpty())",
                         "deadSymsRequiredToBeInt.IsEmpty()");
      if (!bVar5) {
LAB_00448878:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar11 = 0;
LAB_004483f9:
      if (local_88.head != (BVSparseNode *)0x0) {
        pBVar3 = local_88.head;
        pBVar22 = (local_88.alloc)->bvFreeList;
        do {
          pBVar15 = pBVar3;
          pBVar3 = pBVar15->next;
          pBVar15->next = pBVar22;
          pBVar22 = pBVar15;
        } while (pBVar3 != (Type)0x0);
        (local_88.alloc)->bvFreeList = pBVar15;
      }
      if (local_68.head != (BVSparseNode *)0x0) {
        pBVar3 = local_68.head;
        pBVar22 = (local_68.alloc)->bvFreeList;
        do {
          pBVar15 = pBVar3;
          pBVar3 = pBVar15->next;
          pBVar15->next = pBVar22;
          pBVar22 = pBVar15;
        } while (pBVar3 != (Type)0x0);
        (local_68.alloc)->bvFreeList = pBVar15;
      }
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (&this_00->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
                 &this_00->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt);
      pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this_00->func->m_workItem);
      uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
      pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this_00->func->m_workItem);
      uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
      bVar5 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015b6718,TrackCompoundedIntOverflowPhase,uVar9,uVar10);
      if (bVar5) {
        pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this_00->func->m_workItem);
        pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar16);
        pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this_00->func->m_workItem);
        pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar17,(wchar (*) [42])local_f8);
        Output::Print(L"TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u\n",
                      pcVar18,pcVar19,L"Forward",(ulong)this_00->currentBlock->number);
        Output::Print(L"    Input syms to be int-specialized (lossless): ");
        BVSparse<Memory::JitArenaAllocator>::Dump
                  (&this_00->intOverflowDoesNotMatterRange->symsRequiredToBeInt);
        Output::Print(L"    Input syms to be converted to int (lossy):   ");
        BVSparse<Memory::JitArenaAllocator>::Dump
                  (&this_00->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt);
        Output::Print(L"    First instr: ");
        IR::Instr::Dump(instr->m_next);
        Output::Flush();
      }
      ToTypeSpec(this_00,&this_00->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
                 this_00->currentBlock,TyInt32,BailOutIntOnly,false,instr);
      ToTypeSpec(this_00,&this_00->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                 this_00->currentBlock,TyInt32,BailOutIntOnly,true,instr);
      goto LAB_004486b7;
    }
  }
  else {
    local_44 = uVar26;
    local_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      uVar24 = (pBVar23->data).word;
      if (uVar24 != 0) {
        register0x00000000 = (ulong)pBVar23->startIndex;
        uVar25 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar25);
          id = (int)stack0xffffffffffffff60 + (BVIndex)uVar25;
          propertySym = (PropertySym *)SymTable::Find(this->func->m_symTable,id);
          if (propertySym == (PropertySym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_40 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x3718,"(sym)","sym");
            if (!bVar5) goto LAB_00448878;
            *local_40 = 0;
          }
          SVar1 = (propertySym->super_Sym).m_kind;
          this_02 = &this->currentBlock->globOptData;
          if (SVar1 == SymKindProperty) {
LAB_0044804b:
            value = GlobOptBlockData::FindFuturePropertyValue(this_02,propertySym);
          }
          else {
            if (SVar1 != SymKindStack) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *local_40 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                 ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
              if (bVar5) {
                *local_40 = 0;
                goto LAB_0044804b;
              }
              goto LAB_00448878;
            }
            value = GlobOptBlockData::FindValue(this_02,(Sym *)propertySym);
          }
          local_48 = id;
          if (value == (Value *)0x0) {
LAB_004486d3:
            uVar26 = *(uint *)&local_38->field_0xf4;
LAB_004486dd:
            *(uint *)&local_38->field_0xf4 = uVar26 | 2;
            this = local_38;
            goto LAB_004486f6;
          }
          bVar5 = ValueInfo::IsFloatConstant(value->valueInfo);
          if (bVar5) {
            pFVar13 = ValueInfo::AsFloatConstant(value->valueInfo);
            bVar5 = Js::JavascriptNumber::IsInt32OrUInt32(pFVar13->floatValue);
          }
          else {
            bVar5 = false;
          }
          bVar6 = ValueType::IsInt(&value->valueInfo->super_ValueType);
          if ((bVar5 | bVar6) == 1) {
            if (local_38->prePassLoop == (Loop *)0x0) {
              BVSparse<Memory::JitArenaAllocator>::Set(&local_68,(propertySym->super_Sym).m_id);
            }
          }
          else {
            uVar26 = *(uint *)&local_38->field_0xf4;
            if ((uVar26 >> 9 & 1) == 0) goto LAB_004486dd;
            bVar5 = ValueType::IsLikelyInt(&value->valueInfo->super_ValueType);
            if (!bVar5) goto LAB_004486d3;
            if (local_38->prePassLoop == (Loop *)0x0) {
              pSVar14 = GlobOptBlockData::GetCopyPropSym
                                  (&local_38->currentBlock->globOptData,(Sym *)propertySym,value);
              if (pSVar14 == (StackSym *)0x0) {
                if ((propertySym->super_Sym).m_kind != SymKindStack) goto LAB_004486d3;
              }
              else {
                BVSparse<Memory::JitArenaAllocator>::Set(&local_68,(propertySym->super_Sym).m_id);
                BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                                  (&local_68,(pSVar14->super_Sym).m_id);
                if (BVar7 != '\0') {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *local_40 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                     ,0x3753,"(!symsToExclude.Test(copyPropSym->m_id))",
                                     "!symsToExclude.Test(copyPropSym->m_id)");
                  if (!bVar5) goto LAB_00448878;
                  *local_40 = 0;
                }
                BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                                  (&local_38->intOverflowDoesNotMatterRange->
                                    symsRequiredToBeLossyInt,(propertySym->super_Sym).m_id);
                BVar8 = BVSparse<Memory::JitArenaAllocator>::Test
                                  (&local_38->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
                                   (pSVar14->super_Sym).m_id);
                if ((BVar8 == '\0') &&
                   (BVar8 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                                      (&local_88,(pSVar14->super_Sym).m_id), BVar8 == '\0')) {
                  if (BVar7 != '\0') {
                    BVSparse<Memory::JitArenaAllocator>::Set
                              (&local_38->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                               (pSVar14->super_Sym).m_id);
                  }
                }
                else if (BVar7 == '\0') {
                  BVSparse<Memory::JitArenaAllocator>::Clear
                            (&local_38->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                             (pSVar14->super_Sym).m_id);
                }
              }
            }
          }
          uVar24 = uVar24 & ~(1L << (uVar25 & 0x3f));
          uVar25 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
            }
          }
          this = local_38;
        } while (uVar24 != 0);
      }
      pBVar23 = pBVar23->next;
    } while (pBVar23 != (Type)0x0);
    local_48 = 0;
    uVar26 = local_44;
    if ((this->field_0xf4 & 2) == 0) goto LAB_0044827b;
LAB_004486f6:
    uVar26 = local_44;
    pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
    pFVar17 = JITTimeWorkItem::GetJITTimeInfo(local_38->func->m_workItem);
    uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
    bVar5 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015b6718,TrackCompoundedIntOverflowPhase,uVar9,uVar10);
    if (bVar5 && local_38->prePassLoop == (Loop *)0x0) {
      pJVar16 = JITTimeWorkItem::GetJITFunctionBody(local_38->func->m_workItem);
      pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar16);
      pFVar17 = JITTimeWorkItem::GetJITTimeInfo(local_38->func->m_workItem);
      pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar17,(wchar (*) [42])local_f8);
      Output::Print(L"TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u, Disabled ignoring overflows\n"
                    ,pcVar18,pcVar19,L"Forward",(ulong)local_38->currentBlock->number);
      Output::Print(L"    Input sym could not be turned into an int:   %u\n",(ulong)local_48);
      Output::Print(L"    First instr: ");
      IR::Instr::Dump(instr->m_next);
      Output::Flush();
    }
    local_38->intOverflowDoesNotMatterRange = local_38->intOverflowDoesNotMatterRange->next;
  }
  if (local_88.head != (BVSparseNode *)0x0) {
    pBVar22 = (local_88.alloc)->bvFreeList;
    do {
      pBVar15 = local_88.head;
      local_88.head = pBVar15->next;
      pBVar15->next = pBVar22;
      pBVar22 = pBVar15;
    } while (local_88.head != (Type)0x0);
    (local_88.alloc)->bvFreeList = pBVar15;
  }
  if (local_68.head != (BVSparseNode *)0x0) {
    pBVar22 = (local_68.alloc)->bvFreeList;
    do {
      pBVar15 = local_68.head;
      local_68.head = pBVar15->next;
      pBVar15->next = pBVar22;
      pBVar22 = pBVar15;
    } while (local_68.head != (Type)0x0);
    (local_68.alloc)->bvFreeList = pBVar15;
  }
LAB_004486b7:
  return uVar26 == 0x247;
}

Assistant:

bool
GlobOpt::PrepareForIgnoringIntOverflow(IR::Instr *const instr)
{
    Assert(instr);

    const bool isBoundary = instr->m_opcode == Js::OpCode::NoIntOverflowBoundary;

    // Update the instruction's "int overflow matters" flag based on whether we are currently allowing ignoring int overflows.
    // Some operations convert their srcs to int32s, those can still ignore int overflow.
    if(instr->ignoreIntOverflowInRange)
    {
        instr->ignoreIntOverflowInRange = !intOverflowCurrentlyMattersInRange || OpCodeAttr::IsInt32(instr->m_opcode);
    }

    if(!intOverflowDoesNotMatterRange)
    {
        Assert(intOverflowCurrentlyMattersInRange);

        // There are no more ranges of instructions where int overflow does not matter, in this block.
        return isBoundary;
    }

    if(instr == intOverflowDoesNotMatterRange->LastInstr())
    {
        Assert(isBoundary);

        // Reached the last instruction in the range
        intOverflowCurrentlyMattersInRange = true;
        intOverflowDoesNotMatterRange = intOverflowDoesNotMatterRange->Next();
        return isBoundary;
    }

    if(!intOverflowCurrentlyMattersInRange)
    {
        return isBoundary;
    }

    if(instr != intOverflowDoesNotMatterRange->FirstInstr())
    {
        // Have not reached the next range
        return isBoundary;
    }

    Assert(isBoundary);

    // This is the first instruction in a range of instructions where int overflow does not matter. There can be many inputs to
    // instructions in the range, some of which are inputs to the range itself (that is, the values are not defined in the
    // range). Ignoring int overflow is only valid for int operations, so we need to ensure that all inputs to the range are
    // int (not "likely int") before ignoring any overflows in the range. Ensuring that a sym with a "likely int" value is an
    // int requires a bail-out. These bail-out check need to happen before any overflows are ignored, otherwise it's too late.
    // The backward pass tracked all inputs into the range. Iterate over them and verify the values, and insert lossless
    // conversions to int as necessary, before the first instruction in the range. If for any reason all values cannot be
    // guaranteed to be ints, the optimization will be disabled for this range.
    intOverflowCurrentlyMattersInRange = false;
    {
        BVSparse<JitArenaAllocator> tempBv1(tempAlloc);
        BVSparse<JitArenaAllocator> tempBv2(tempAlloc);

        {
            // Just renaming the temp BVs for this section to indicate how they're used so that it makes sense
            BVSparse<JitArenaAllocator> &symsToExclude = tempBv1;
            BVSparse<JitArenaAllocator> &symsToInclude = tempBv2;
#if DBG_DUMP
            SymID couldNotConvertSymId = 0;
#endif
            FOREACH_BITSET_IN_SPARSEBV(id, intOverflowDoesNotMatterRange->SymsRequiredToBeInt())
            {
                Sym *const sym = func->m_symTable->Find(id);
                Assert(sym);

                // Some instructions with property syms are also tracked by the backward pass, and may be included in the range
                // (LdSlot for instance). These property syms don't get their values until either copy-prop resolves a value for
                // them, or a new value is created once the use of the property sym is reached. In either case, we're not that
                // far yet, so we need to find the future value of the property sym by evaluating copy-prop in reverse.
                Value *const value = sym->IsStackSym() ? CurrentBlockData()->FindValue(sym) : CurrentBlockData()->FindFuturePropertyValue(sym->AsPropertySym());
                if(!value)
                {
#if DBG_DUMP
                    couldNotConvertSymId = id;
#endif
                    intOverflowCurrentlyMattersInRange = true;
                    BREAK_BITSET_IN_SPARSEBV;
                }

                const bool isInt32OrUInt32Float =
                    value->GetValueInfo()->IsFloatConstant() &&
                    Js::JavascriptNumber::IsInt32OrUInt32(value->GetValueInfo()->AsFloatConstant()->FloatValue());
                if(value->GetValueInfo()->IsInt() || isInt32OrUInt32Float)
                {
                    if(!IsLoopPrePass())
                    {
                        // Input values that are already int can be excluded from int-specialization. We can treat unsigned
                        // int32 values as int32 values (ignoring the overflow), since the values will only be used inside the
                        // range where overflow does not matter.
                        symsToExclude.Set(sym->m_id);
                    }
                    continue;
                }

                if(!DoAggressiveIntTypeSpec() || !value->GetValueInfo()->IsLikelyInt())
                {
                    // When aggressive int specialization is off, syms with "likely int" values cannot be forced to int since
                    // int bail-out checks are not allowed in that mode. Similarly, with aggressive int specialization on, it
                    // wouldn't make sense to force non-"likely int" values to int since it would almost guarantee a bail-out at
                    // runtime. In both cases, just disable ignoring overflow for this range.
#if DBG_DUMP
                    couldNotConvertSymId = id;
#endif
                    intOverflowCurrentlyMattersInRange = true;
                    BREAK_BITSET_IN_SPARSEBV;
                }

                if(IsLoopPrePass())
                {
                    // The loop prepass does not modify bit-vectors. Since it doesn't add bail-out checks, it also does not need
                    // to specialize anything up-front. It only needs to be consistent in how it determines whether to allow
                    // ignoring overflow for a range, based on the values of inputs into the range.
                    continue;
                }

                // Since input syms are tracked in the backward pass, where there is no value tracking, it will not be aware of
                // copy-prop. If a copy-prop sym is available, it will be used instead, so exclude the original sym and include
                // the copy-prop sym for specialization.
                StackSym *const copyPropSym = CurrentBlockData()->GetCopyPropSym(sym, value);
                if(copyPropSym)
                {
                    symsToExclude.Set(sym->m_id);
                    Assert(!symsToExclude.Test(copyPropSym->m_id));

                    const bool needsToBeLossless =
                        !intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Test(sym->m_id);
                    if(intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Test(copyPropSym->m_id) ||
                        symsToInclude.TestAndSet(copyPropSym->m_id))
                    {
                        // The copy-prop sym is already included
                        if(needsToBeLossless)
                        {
                            // The original sym needs to be lossless, so make the copy-prop sym lossless as well.
                            intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Clear(copyPropSym->m_id);
                        }
                    }
                    else if(!needsToBeLossless)
                    {
                        // The copy-prop sym was not included before, and the original sym can be lossy, so make it lossy.
                        intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Set(copyPropSym->m_id);
                    }
                }
                else if(!sym->IsStackSym())
                {
                    // Only stack syms can be converted to int, and copy-prop syms are stack syms. If a copy-prop sym was not
                    // found for the property sym, we can't ignore overflows in this range.
#if DBG_DUMP
                    couldNotConvertSymId = id;
#endif
                    intOverflowCurrentlyMattersInRange = true;
                    BREAK_BITSET_IN_SPARSEBV;
                }
            } NEXT_BITSET_IN_SPARSEBV;

            if(intOverflowCurrentlyMattersInRange)
            {
#if DBG_DUMP
                if(PHASE_TRACE(Js::TrackCompoundedIntOverflowPhase, func) && !IsLoopPrePass())
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(
                        _u("TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u, Disabled ignoring overflows\n"),
                        func->GetJITFunctionBody()->GetDisplayName(),
                        func->GetDebugNumberSet(debugStringBuffer),
                        Js::PhaseNames[Js::ForwardPhase],
                        currentBlock->GetBlockNum());
                    Output::Print(_u("    Input sym could not be turned into an int:   %u\n"), couldNotConvertSymId);
                    Output::Print(_u("    First instr: "));
                    instr->m_next->Dump();
                    Output::Flush();
                }
#endif
                intOverflowDoesNotMatterRange = intOverflowDoesNotMatterRange->Next();
                return isBoundary;
            }

            if(IsLoopPrePass())
            {
                return isBoundary;
            }

            // Update the syms to specialize after enumeration
            intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Minus(&symsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Minus(&symsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Or(&symsToInclude);
        }

        {
            // Exclude syms that are already live as lossless int32, and exclude lossy conversions of syms that are already live
            // as lossy int32.
            //     symsToExclude = liveInt32Syms - liveLossyInt32Syms                   // syms live as lossless int
            //     lossySymsToExclude = symsRequiredToBeLossyInt & liveLossyInt32Syms;  // syms we want as lossy int that are already live as lossy int
            //     symsToExclude |= lossySymsToExclude
            //     symsRequiredToBeInt -= symsToExclude
            //     symsRequiredToBeLossyInt -= symsToExclude
            BVSparse<JitArenaAllocator> &symsToExclude = tempBv1;
            BVSparse<JitArenaAllocator> &lossySymsToExclude = tempBv2;
            symsToExclude.Minus(CurrentBlockData()->liveInt32Syms, CurrentBlockData()->liveLossyInt32Syms);
            lossySymsToExclude.And(
                intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt(),
                CurrentBlockData()->liveLossyInt32Syms);
            symsToExclude.Or(&lossySymsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Minus(&symsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Minus(&symsToExclude);
        }

#if DBG
        {
            // Verify that the syms to be converted are live
            //     liveSyms = liveInt32Syms | liveFloat64Syms | liveVarSyms
            //     deadSymsRequiredToBeInt = symsRequiredToBeInt - liveSyms
            BVSparse<JitArenaAllocator> &liveSyms = tempBv1;
            BVSparse<JitArenaAllocator> &deadSymsRequiredToBeInt = tempBv2;
            liveSyms.Or(CurrentBlockData()->liveInt32Syms, CurrentBlockData()->liveFloat64Syms);
            liveSyms.Or(CurrentBlockData()->liveVarSyms);
            deadSymsRequiredToBeInt.Minus(intOverflowDoesNotMatterRange->SymsRequiredToBeInt(), &liveSyms);
            Assert(deadSymsRequiredToBeInt.IsEmpty());
        }
#endif
    }

    // Int-specialize the syms before the first instruction of the range (the current instruction)
    intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Minus(intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt());

#if DBG_DUMP
    if(PHASE_TRACE(Js::TrackCompoundedIntOverflowPhase, func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(
            _u("TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u\n"),
            func->GetJITFunctionBody()->GetDisplayName(),
            func->GetDebugNumberSet(debugStringBuffer),
            Js::PhaseNames[Js::ForwardPhase],
            currentBlock->GetBlockNum());
        Output::Print(_u("    Input syms to be int-specialized (lossless): "));
        intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Dump();
        Output::Print(_u("    Input syms to be converted to int (lossy):   "));
        intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Dump();
        Output::Print(_u("    First instr: "));
        instr->m_next->Dump();
        Output::Flush();
    }
#endif

    ToInt32(intOverflowDoesNotMatterRange->SymsRequiredToBeInt(), currentBlock, false /* lossy */, instr);
    ToInt32(intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt(), currentBlock, true /* lossy */, instr);
    return isBoundary;
}